

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_api.hpp
# Opt level: O0

hrgls_Status __thiscall
hrgls::datablob::DataBlobSource::SetStreamCallback
          (DataBlobSource *this,StreamCallback callback,void *userdata)

{
  DataBlobSource_private *pDVar1;
  mapped_type mVar2;
  mapped_type *pmVar3;
  key_type local_58;
  key_type local_50;
  key_type local_48 [3];
  lock_guard<std::mutex> local_30;
  lock_guard<std::mutex> lock;
  void *userdata_local;
  StreamCallback callback_local;
  DataBlobSource *this_local;
  
  if (this->m_private == (DataBlobSource_private *)0x0) {
    this_local._4_4_ = 0x3ee;
  }
  else {
    lock._M_device = (mutex_type *)userdata;
    std::lock_guard<std::mutex>::lock_guard(&local_30,&this->m_private->m_cppMutex);
    this->m_private->m_cppHandler = callback;
    this->m_private->m_cppUserData = lock._M_device;
    if (callback == (StreamCallback)0x0) {
      mVar2 = hrgls_DataBlobSourceSetStreamCallback(this->m_private->m_stream,0);
      pDVar1 = this->m_private;
      local_50._M_thread = (native_handle_type)std::this_thread::get_id();
      pmVar3 = std::
               map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
               ::operator[](&pDVar1->m_status,&local_50);
      *pmVar3 = mVar2;
    }
    else {
      mVar2 = hrgls_DataBlobSourceSetStreamCallback(this->m_private->m_stream,StreamCallbackHandler)
      ;
      pDVar1 = this->m_private;
      local_48[0]._M_thread = (native_handle_type)std::this_thread::get_id();
      pmVar3 = std::
               map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
               ::operator[](&pDVar1->m_status,local_48);
      *pmVar3 = mVar2;
    }
    pDVar1 = this->m_private;
    local_58._M_thread = (native_handle_type)std::this_thread::get_id();
    pmVar3 = std::
             map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
             ::operator[](&pDVar1->m_status,&local_58);
    this_local._4_4_ = *pmVar3;
    std::lock_guard<std::mutex>::~lock_guard(&local_30);
  }
  return this_local._4_4_;
}

Assistant:

hrgls_Status DataBlobSource::SetStreamCallback(StreamCallback callback, void *userdata)
    {
      if (!m_private) {
        return hrgls_STATUS_NULL_OBJECT_POINTER;
      }

      // Lock the mutex while we're changing the handler data so we don't
      // change it out from under an active callback handler.
      std::lock_guard<std::mutex> lock(m_private->m_cppMutex);

      m_private->m_cppHandler = callback;
      m_private->m_cppUserData = userdata;

      // If we are supposed to be calling a callback handler, then set our callback handler
      // as the intercept.  If not, then set it to nullptr so that no callbacks are called.
      if (callback) {
        m_private->m_status[std::this_thread::get_id()] = hrgls_DataBlobSourceSetStreamCallback(m_private->m_stream,
          StreamCallbackHandler, m_private);
      } else {
        m_private->m_status[std::this_thread::get_id()] = hrgls_DataBlobSourceSetStreamCallback(m_private->m_stream,
          nullptr, nullptr);
      }
      return m_private->m_status[std::this_thread::get_id()];
    }